

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O2

void __thiscall Patch::Node::serialize(Node *this,Serializer *output)

{
  Point::serialize(&this->old_extent,output);
  Point::serialize(&this->new_extent,output);
  Point::serialize(&this->old_distance_from_left_ancestor,output);
  Point::serialize(&this->new_distance_from_left_ancestor,output);
  if ((this->old_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
      super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
      super__Head_base<0UL,_Text_*,_false>._M_head_impl == (Text *)0x0) {
    Serializer::append<unsigned_int>(output,0);
    Serializer::append<unsigned_int>(output,this->old_text_size_);
  }
  else {
    Serializer::append<unsigned_int>(output,1);
    Text::serialize((this->old_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>.
                    _M_t.super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
                    super__Head_base<0UL,_Text_*,_false>._M_head_impl,output);
  }
  if ((this->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
      super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
      super__Head_base<0UL,_Text_*,_false>._M_head_impl != (Text *)0x0) {
    Serializer::append<unsigned_int>(output,1);
    Text::serialize((this->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>.
                    _M_t.super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
                    super__Head_base<0UL,_Text_*,_false>._M_head_impl,output);
    return;
  }
  Serializer::append<unsigned_int>(output,0);
  return;
}

Assistant:

void serialize(Serializer &output) const {
    old_extent.serialize(output);
    new_extent.serialize(output);
    old_distance_from_left_ancestor.serialize(output);
    new_distance_from_left_ancestor.serialize(output);
    if (old_text) {
      output.append<uint32_t>(1);
      old_text->serialize(output);
    } else {
      output.append<uint32_t>(0);
      output.append<uint32_t>(old_text_size_);
    }
    if (new_text) {
      output.append<uint32_t>(1);
      new_text->serialize(output);
    } else {
      output.append<uint32_t>(0);
    }
  }